

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O1

void Assimp::IFC::ProcessParametrizedProfile
               (IfcParameterizedProfileDef *def,TempMesh *meshout,ConversionData *conv)

{
  pointer *ppaVar1;
  _func_int **pp_Var2;
  iterator iVar3;
  double dVar4;
  double dVar5;
  undefined4 uVar6;
  long lVar7;
  IfcAxis2Placement2D *in;
  long *plVar8;
  size_type *psVar9;
  _func_int *p_Var10;
  ulong __n;
  float fVar11;
  undefined4 uVar12;
  uint uVar13;
  IfcMatrix4 trafo;
  undefined8 local_228;
  allocator<char> local_209;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined4 uStack_1f0;
  uint uStack_1ec;
  undefined1 local_1e8 [8];
  double dStack_1e0;
  double local_1d8;
  double local_1d0;
  double dStack_1c8;
  double local_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double local_190;
  double dStack_188;
  double local_180;
  double dStack_178;
  double local_170;
  double local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48 [2];
  long local_38 [2];
  
  pp_Var2 = (def->super_IfcProfileDef).
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper;
  p_Var10 = (_func_int *)
            ((long)&(def->super_IfcProfileDef).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]);
  lVar7 = __dynamic_cast(p_Var10,&STEP::Object::typeinfo,
                         &Schema_2x3::IfcRectangleProfileDef::typeinfo,0xffffffffffffffff);
  if (lVar7 == 0) {
    lVar7 = __dynamic_cast(p_Var10,&STEP::Object::typeinfo,
                           &Schema_2x3::IfcCircleProfileDef::typeinfo,0xffffffffffffffff);
    if (lVar7 == 0) {
      lVar7 = __dynamic_cast(p_Var10,&STEP::Object::typeinfo,
                             &Schema_2x3::IfcIShapeProfileDef::typeinfo,0xffffffffffffffff);
      if (lVar7 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_48,
                   *(char **)(&(def->super_IfcProfileDef).
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                               field_0x10 + (long)pp_Var2[-3]),&local_209);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x6e3235);
        psVar9 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_68.field_2._M_allocated_capacity = *psVar9;
          local_68.field_2._8_8_ = plVar8[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar9;
          local_68._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_68._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1e8,
                   &local_68);
        LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base((ios_base *)&dStack_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
      }
      else {
        dVar4 = *(double *)(lVar7 + 0x88);
        local_208 = *(double *)(lVar7 + 0x80) - *(double *)(lVar7 + 0x90);
        local_1f8 = *(double *)(lVar7 + 0x98);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                  (&meshout->mVerts,0xc);
        local_1e8 = (undefined1  [8])0x0;
        dStack_1e0 = 0.0;
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->x = 0.0;
          (iVar3._M_current)->y = 0.0;
          (iVar3._M_current)->z = 0.0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_208 = local_208 * 0.5;
        dStack_1e0 = *(double *)(lVar7 + 0x98);
        local_1e8 = (undefined1  [8])0x0;
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_1f8 = local_1f8 + local_1f8;
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
          dVar5 = local_1f8;
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = 0.0;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          dVar5 = local_1f8 + local_1f8;
        }
        dVar4 = dVar4 - dVar5;
        dStack_1e0 = *(double *)(lVar7 + 0x98);
        local_1e8 = (undefined1  [8])local_208;
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = local_208;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        dStack_1e0 = *(double *)(lVar7 + 0x98) + dVar4;
        local_1e8 = (undefined1  [8])local_208;
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = local_208;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        dStack_1e0 = *(double *)(lVar7 + 0x98) + dVar4;
        local_1e8 = (undefined1  [8])0x0;
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = 0.0;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        dStack_1e0 = *(double *)(lVar7 + 0x88);
        local_1e8 = (undefined1  [8])0x0;
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = 0.0;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1e8 = *(undefined1 (*) [8])(lVar7 + 0x80);
        dStack_1e0 = *(double *)(lVar7 + 0x88);
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = (double)local_1e8;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1e8 = *(undefined1 (*) [8])(lVar7 + 0x80);
        dStack_1e0 = *(double *)(lVar7 + 0x98) + dVar4;
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = (double)local_1e8;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1e8 = (undefined1  [8])(*(double *)(lVar7 + 0x90) + local_208);
        dStack_1e0 = dVar4 + *(double *)(lVar7 + 0x98);
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = (double)local_1e8;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1e8 = (undefined1  [8])(local_208 + *(double *)(lVar7 + 0x90));
        dStack_1e0 = *(double *)(lVar7 + 0x98);
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = (double)local_1e8;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1e8 = *(undefined1 (*) [8])(lVar7 + 0x80);
        dStack_1e0 = *(double *)(lVar7 + 0x98);
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = (double)local_1e8;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1e8 = *(undefined1 (*) [8])(lVar7 + 0x80);
        dStack_1e0 = 0.0;
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = (double)local_1e8;
          (iVar3._M_current)->y = 0.0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1e8._0_4_ = 0xc;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&meshout->mVertcnt,(uint *)local_1e8);
      }
      if (lVar7 == 0) {
        return;
      }
      goto LAB_0054ab47;
    }
    uVar13 = conv->settings->cylindricalTessellation;
    __n = (ulong)(int)uVar13;
    dVar4 = *(double *)(lVar7 + 0x80);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&meshout->mVerts,__n);
    if ((long)__n < 0) {
      fVar11 = (float)((ulong)(uVar13 & 1) | __n >> 1);
      fVar11 = fVar11 + fVar11;
    }
    else {
      fVar11 = (float)(int)uVar13;
    }
    if (__n != 0) {
      local_70 = (double)(6.2831855 / fVar11);
      dVar5 = 0.0;
      do {
        local_208 = dVar5;
        local_1f8 = cos(dVar5);
        local_1f8 = local_1f8 * dVar4;
        dStack_1e0 = ::sin(local_208);
        dStack_1e0 = dStack_1e0 * dVar4;
        local_1e8 = (undefined1  [8])local_1f8;
        local_1d8 = 0.0;
        iVar3._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (meshout->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                     (aiVector3t<double> *)local_1e8);
        }
        else {
          (iVar3._M_current)->z = 0.0;
          (iVar3._M_current)->x = local_1f8;
          (iVar3._M_current)->y = dStack_1e0;
          ppaVar1 = &(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        dVar5 = local_208 + local_70;
        __n = __n - 1;
      } while (__n != 0);
    }
    local_1e8._0_4_ = uVar13;
  }
  else {
    local_208 = *(double *)(lVar7 + 0x80) * 0.5;
    uStack_200 = 0;
    dVar4 = *(double *)(lVar7 + 0x88) * 0.5;
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&meshout->mVerts,
               ((long)(meshout->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(meshout->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 4);
    local_228._4_4_ = (uint)((ulong)dVar4 >> 0x20);
    local_1e8 = (undefined1  [8])local_208;
    local_1d8 = 0.0;
    iVar3._M_current =
         (meshout->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_228._0_4_ = SUB84(dVar4,0);
    uVar6 = (undefined4)local_228;
    if (iVar3._M_current ==
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      dStack_1e0 = dVar4;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                 (aiVector3t<double> *)local_1e8);
    }
    else {
      (iVar3._M_current)->z = 0.0;
      (iVar3._M_current)->x = local_208;
      (iVar3._M_current)->y = dVar4;
      ppaVar1 = &(meshout->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_1e8 = (undefined1  [8])-local_208;
    local_1d8 = 0.0;
    iVar3._M_current =
         (meshout->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_1f8 = -local_208;
      uStack_1f0 = (undefined4)uStack_200;
      uStack_1ec = uStack_200._4_4_ ^ 0x80000000;
      dStack_1e0 = dVar4;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                 (aiVector3t<double> *)local_1e8);
      uVar12 = (undefined4)local_1f8;
      uVar13 = local_1f8._4_4_;
    }
    else {
      (iVar3._M_current)->z = 0.0;
      (iVar3._M_current)->x = (double)local_1e8;
      (iVar3._M_current)->y = dVar4;
      ppaVar1 = &(meshout->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
      uVar12 = (undefined4)local_208;
      uVar13 = local_208._4_4_ ^ 0x80000000;
    }
    local_228._4_4_ = local_228._4_4_ ^ 0x80000000;
    local_1e8 = (undefined1  [8])CONCAT44(uVar13,uVar12);
    dStack_1e0 = -dVar4;
    local_1d8 = 0.0;
    iVar3._M_current =
         (meshout->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_228 = -dVar4;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                 (aiVector3t<double> *)local_1e8);
    }
    else {
      (iVar3._M_current)->z = 0.0;
      (iVar3._M_current)->x = (double)local_1e8;
      (iVar3._M_current)->y = dStack_1e0;
      ppaVar1 = &(meshout->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_1e8 = (undefined1  [8])local_208;
    dStack_1e0 = (double)CONCAT44(local_228._4_4_,uVar6);
    local_1d8 = 0.0;
    iVar3._M_current =
         (meshout->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar3,
                 (aiVector3t<double> *)local_1e8);
    }
    else {
      (iVar3._M_current)->z = 0.0;
      (iVar3._M_current)->x = local_208;
      (iVar3._M_current)->y = dStack_1e0;
      ppaVar1 = &(meshout->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_1e8._0_4_ = 4;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&meshout->mVertcnt,(uint *)local_1e8);
LAB_0054ab47:
  local_1e8 = (undefined1  [8])0x3ff0000000000000;
  dStack_1e0 = 0.0;
  local_1d8 = 0.0;
  local_1d0 = 0.0;
  dStack_1c8 = 0.0;
  local_1c0 = 1.0;
  local_1b8 = 0.0;
  dStack_1b0 = 0.0;
  local_1a8 = 0.0;
  dStack_1a0 = 0.0;
  local_198 = 1.0;
  local_190 = 0.0;
  dStack_188 = 0.0;
  local_180 = 0.0;
  dStack_178 = 0.0;
  local_170 = 1.0;
  in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement2D>
                 (*(LazyObject **)&(def->super_IfcProfileDef).field_0x68);
  ConvertAxisPlacement((IfcMatrix4 *)local_1e8,in);
  TempMesh::Transform(meshout,(IfcMatrix4 *)local_1e8);
  return;
}

Assistant:

void ProcessParametrizedProfile(const Schema_2x3::IfcParameterizedProfileDef& def, TempMesh& meshout, ConversionData& conv)
{
    if(const Schema_2x3::IfcRectangleProfileDef* const cprofile = def.ToPtr<Schema_2x3::IfcRectangleProfileDef>()) {
        const IfcFloat x = cprofile->XDim*0.5f, y = cprofile->YDim*0.5f;

        meshout.mVerts.reserve(meshout.mVerts.size()+4);
        meshout.mVerts.push_back( IfcVector3( x, y, 0.f ));
        meshout.mVerts.push_back( IfcVector3(-x, y, 0.f ));
        meshout.mVerts.push_back( IfcVector3(-x,-y, 0.f ));
        meshout.mVerts.push_back( IfcVector3( x,-y, 0.f ));
        meshout.mVertcnt.push_back(4);
    }
    else if( const Schema_2x3::IfcCircleProfileDef* const circle = def.ToPtr<Schema_2x3::IfcCircleProfileDef>()) {
        if(def.ToPtr<Schema_2x3::IfcCircleHollowProfileDef>()) {
            // TODO
        }
        const size_t segments = conv.settings.cylindricalTessellation;
        const IfcFloat delta = AI_MATH_TWO_PI_F/segments, radius = circle->Radius;

        meshout.mVerts.reserve(segments);

        IfcFloat angle = 0.f;
        for(size_t i = 0; i < segments; ++i, angle += delta) {
            meshout.mVerts.push_back( IfcVector3( std::cos(angle)*radius, std::sin(angle)*radius, 0.f ));
        }

        meshout.mVertcnt.push_back(static_cast<unsigned int>(segments));
    }
    else if( const Schema_2x3::IfcIShapeProfileDef* const ishape = def.ToPtr<Schema_2x3::IfcIShapeProfileDef>()) {
        // construct simplified IBeam shape
        const IfcFloat offset = (ishape->OverallWidth - ishape->WebThickness) / 2;
        const IfcFloat inner_height = ishape->OverallDepth - ishape->FlangeThickness * 2;

        meshout.mVerts.reserve(12);
        meshout.mVerts.push_back(IfcVector3(0,0,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(offset,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(offset,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->OverallDepth,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->OverallDepth,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(offset+ishape->WebThickness,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(offset+ishape->WebThickness,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,0,0));

        meshout.mVertcnt.push_back(12);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcParameterizedProfileDef entity, type is " + def.GetClassName());
        return;
    }

    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, *def.Position);
    meshout.Transform(trafo);
}